

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_stats.cpp
# Opt level: O1

string * __thiscall
duckdb::ListStats::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ListStats *this,BaseStatistics *stats)

{
  BaseStatistics *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string local_38;
  
  this_00 = GetChildStats((BaseStatistics *)this);
  local_58[0] = local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"[%s]","");
  BaseStatistics::ToString_abi_cxx11_(&local_38,this_00);
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_58,&local_38,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string ListStats::ToString(const BaseStatistics &stats) {
	auto &child_stats = ListStats::GetChildStats(stats);
	return StringUtil::Format("[%s]", child_stats.ToString());
}